

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::ChangeRPath
               (string *file,string *oldRPath,string *newRPath,string *emsg,bool *changed)

{
  string *this;
  char *pcVar1;
  bool bVar2;
  long lVar3;
  StringEntry *pSVar4;
  char *pcVar5;
  undefined7 uVar10;
  size_type sVar6;
  size_t sVar7;
  ostream *poVar8;
  long *plVar9;
  undefined1 *puVar11;
  byte bVar12;
  uint uVar13;
  string *psVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  char *se_name [2];
  StringEntry *se [2];
  cmELF elf;
  ostringstream e;
  cmSystemToolsRPathInfo rp [2];
  undefined1 local_398 [4];
  uint local_394;
  bool *local_390;
  ulong local_388;
  string *local_380;
  string *local_378;
  string *local_370;
  char *local_368 [2];
  StringEntry *local_358 [3];
  string *local_340;
  char *local_338;
  ulong local_330;
  ulong local_328;
  cmELF local_320;
  long *local_2f8 [2];
  long local_2e8 [2];
  long *local_2d8;
  filebuf local_2d0 [8];
  long local_2c8 [2];
  byte abStack_2b8 [80];
  ios_base local_268 [136];
  ios_base local_1e0 [264];
  unsigned_long local_d8 [2];
  ulong local_c8 [2];
  undefined1 local_b8 [16];
  string local_a8 [8];
  ulong local_a0 [11];
  long local_48 [3];
  
  if (changed != (bool *)0x0) {
    *changed = false;
  }
  lVar3 = 0xa0;
  puVar11 = local_b8;
  do {
    *(undefined1 **)(puVar11 + -0x10) = puVar11;
    *(undefined8 *)(puVar11 + -8) = 0;
    *puVar11 = 0;
    *(undefined1 **)(puVar11 + 0x10) = puVar11 + 0x20;
    *(undefined8 *)(puVar11 + 0x18) = 0;
    puVar11[0x20] = 0;
    puVar11 = puVar11 + 0x50;
    lVar3 = lVar3 + -0x50;
  } while (lVar3 != 0);
  local_378 = newRPath;
  local_370 = oldRPath;
  cmELF::cmELF(&local_320,(file->_M_dataplus)._M_p);
  local_358[0] = (StringEntry *)0x0;
  local_358[1] = (StringEntry *)0x0;
  local_368[0] = (char *)0x0;
  local_368[1] = (char *)0x0;
  pSVar4 = cmELF::GetRPath(&local_320);
  if (pSVar4 != (StringEntry *)0x0) {
    local_368[0] = "RPATH";
    local_358[0] = pSVar4;
  }
  uVar13 = (uint)(pSVar4 != (StringEntry *)0x0);
  pcVar5 = (char *)cmELF::GetRunPath(&local_320);
  if ((StringEntry *)pcVar5 != (StringEntry *)0x0) {
    *(char **)((long)local_358 + (ulong)(uVar13 * 8)) = pcVar5;
    pcVar5 = "RUNPATH";
    *(char **)((long)local_368 + (ulong)(uVar13 * 8)) = "RUNPATH";
    uVar13 = uVar13 + 1;
  }
  uVar10 = (undefined7)((ulong)pcVar5 >> 8);
  if (uVar13 == 0) {
    local_394 = (uint)CONCAT71(uVar10,1);
    if (local_378->_M_string_length == 0) {
      uVar13 = 0;
      bVar17 = false;
      bVar2 = true;
    }
    else {
      if (emsg == (string *)0x0) {
        bVar17 = false;
        goto LAB_0012d0e9;
      }
      uVar13 = 0;
      std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x1c0534);
      std::__cxx11::string::_M_append((char *)emsg,(ulong)local_320.ErrorMessage._M_dataplus._M_p);
      bVar17 = false;
      bVar2 = false;
    }
  }
  else if (uVar13 == 0) {
    local_394 = (uint)CONCAT71(uVar10,1);
    bVar17 = true;
LAB_0012d0e9:
    uVar13 = 0;
    bVar2 = false;
  }
  else {
    local_340 = file;
    local_328 = (ulong)uVar13;
    local_394 = 1;
    uVar15 = 0;
    uVar16 = 0;
    local_390 = changed;
    local_380 = emsg;
    do {
      if (((int)uVar16 == 0) || (local_d8[0] != local_358[uVar15]->Position)) {
        pSVar4 = local_358[uVar15];
        sVar6 = cmSystemToolsFindRPath(&pSVar4->Value,local_370);
        local_388 = uVar16;
        if (sVar6 == 0xffffffffffffffff) {
          sVar6 = cmSystemToolsFindRPath(&pSVar4->Value,local_378);
          bVar17 = sVar6 != 0xffffffffffffffff;
          uVar13 = local_394 & 0xff;
          if (bVar17) {
            uVar13 = 0;
          }
          if (emsg == (string *)0x0 || bVar17) {
            bVar12 = bVar17 * '\x03' + 1;
            local_394 = uVar13;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_2d8,"The current ",0xc);
            pcVar5 = local_368[uVar15];
            if (pcVar5 == (char *)0x0) {
              std::ios::clear((int)local_398 + (int)local_2d8[-3] + 0xc0);
            }
            else {
              sVar7 = strlen(pcVar5);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2d8,pcVar5,sVar7)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2d8," is:\n",5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2d8,"  ",2);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_2d8,(pSVar4->Value)._M_dataplus._M_p,
                                (pSVar4->Value)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"which does not contain:\n",0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  ",2);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(local_370->_M_dataplus)._M_p,local_370->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"as was expected.",0x10);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)emsg,(string *)local_2f8);
            if (local_2f8[0] != local_2e8) {
              operator_delete(local_2f8[0],local_2e8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d8);
            std::ios_base::~ios_base(local_268);
            bVar12 = 1;
          }
        }
        else {
          lVar3 = (long)(int)uVar16;
          local_d8[lVar3 * 10] = pSVar4->Position;
          local_d8[lVar3 * 10 + 1] = pSVar4->Size;
          local_330 = uVar15;
          pcVar5 = local_368[uVar15];
          pcVar1 = (char *)local_c8[lVar3 * 10 + 1];
          strlen(pcVar5);
          local_338 = pcVar5;
          std::__cxx11::string::_M_replace((ulong)(local_c8 + lVar3 * 10),0,pcVar1,(ulong)pcVar5);
          std::__cxx11::string::substr((ulong)&local_2d8,(ulong)pSVar4);
          uVar15 = local_330;
          this = local_a8 + lVar3 * 0x50;
          std::__cxx11::string::operator=(this,(string *)&local_2d8);
          if (local_2d8 != local_2c8) {
            operator_delete(local_2d8,local_2c8[0] + 1);
          }
          std::__cxx11::string::_M_append((char *)this,(ulong)(local_378->_M_dataplus)._M_p);
          emsg = local_380;
          std::__cxx11::string::substr((ulong)&local_2d8,(ulong)pSVar4);
          std::__cxx11::string::_M_append((char *)this,(ulong)local_2d8);
          if (local_2d8 != local_2c8) {
            operator_delete(local_2d8,local_2c8[0] + 1);
          }
          local_394 = local_394 & 0xff;
          if (local_a0[lVar3 * 10] != 0) {
            local_394 = 0;
          }
          if (local_d8[lVar3 * 10 + 1] < local_a0[lVar3 * 10] + 1) {
            bVar12 = 1;
            if (emsg != (string *)0x0) {
              std::__cxx11::string::_M_replace
                        ((ulong)emsg,0,(char *)emsg->_M_string_length,0x1c05aa);
              std::__cxx11::string::append((char *)emsg);
              std::__cxx11::string::append((char *)emsg);
            }
          }
          else {
            local_388 = (ulong)((int)local_388 + 1);
            bVar12 = 0;
          }
        }
        uVar16 = local_388;
        if ((bVar12 & 3) != 0) goto LAB_0012d065;
      }
      uVar15 = uVar15 + 1;
    } while (local_328 != uVar15);
    bVar12 = 0;
LAB_0012d065:
    uVar13 = (uint)uVar16;
    bVar17 = (bVar12 & 5) == 0;
    bVar2 = false;
    file = local_340;
    changed = local_390;
  }
  cmELF::~cmELF(&local_320);
  if (!bVar17) goto LAB_0012d313;
  if (uVar13 != 0) {
    if ((local_394 & 1) != 0) {
      bVar2 = RemoveRPath(file,emsg,changed);
      goto LAB_0012d313;
    }
    std::ofstream::ofstream(&local_2d8,(file->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
    if ((abStack_2b8[local_2d8[-3]] & 5) == 0) {
      bVar17 = (int)uVar13 < 1;
      if (0 < (int)uVar13) {
        local_388 = (ulong)uVar13;
        uVar15 = 0;
        local_390 = changed;
        local_380 = emsg;
        do {
          plVar9 = (long *)std::ostream::seekp((ostream *)&local_2d8,local_d8[uVar15 * 10],0);
          psVar14 = local_380;
          if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) != 0) {
            if (local_380 != (string *)0x0) {
              std::__cxx11::string::operator=((string *)local_380,"Error seeking to ");
              changed = local_390;
              std::__cxx11::string::_M_append((char *)psVar14,local_c8[uVar15 * 10]);
LAB_0012d2af:
              std::__cxx11::string::append((char *)psVar14);
              goto LAB_0012d2b7;
            }
            bVar17 = false;
            bVar2 = false;
            changed = local_390;
            break;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2d8,*(char **)(local_a8 + uVar15 * 0x50),
                     local_a0[uVar15 * 10]);
          for (uVar16 = local_a0[uVar15 * 10]; psVar14 = local_380, changed = local_390,
              uVar16 < local_d8[uVar15 * 10 + 1]; uVar16 = uVar16 + 1) {
            local_320.Internal._0_1_ = 0;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_2d8,(char *)&local_320,1);
          }
          if ((abStack_2b8[local_2d8[-3]] & 5) != 0) {
            if (local_380 != (string *)0x0) {
              std::__cxx11::string::operator=((string *)local_380,"Error writing the new ");
              std::__cxx11::string::_M_append((char *)psVar14,local_c8[uVar15 * 10]);
              goto LAB_0012d2af;
            }
            goto LAB_0012d2b7;
          }
          uVar15 = uVar15 + 1;
          bVar17 = local_388 <= uVar15;
        } while (uVar15 != local_388);
      }
    }
    else if (emsg == (string *)0x0) {
LAB_0012d2b7:
      bVar17 = false;
      bVar2 = false;
    }
    else {
      bVar17 = false;
      std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x1c05dc);
      bVar2 = false;
    }
    local_2d8 = _VTT;
    *(undefined8 *)(local_2d0 + _VTT[-3] + -8) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf(local_2d0);
    std::ios_base::~ios_base(local_1e0);
    bVar2 = (bool)(bVar2 | bVar17);
    if ((changed == (bool *)0x0) || (bVar17 == false)) goto LAB_0012d313;
    *changed = true;
  }
  bVar2 = true;
LAB_0012d313:
  lVar3 = -0xa0;
  plVar9 = local_48;
  do {
    if (plVar9 != (long *)plVar9[-2]) {
      operator_delete((long *)plVar9[-2],*plVar9 + 1);
    }
    if (plVar9 + -4 != (long *)plVar9[-6]) {
      operator_delete((long *)plVar9[-6],plVar9[-4] + 1);
    }
    plVar9 = plVar9 + -10;
    lVar3 = lVar3 + 0x50;
  } while (lVar3 != 0);
  return bVar2;
}

Assistant:

bool cmSystemTools::ChangeRPath(std::string const& file,
                                std::string const& oldRPath,
                                std::string const& newRPath, std::string* emsg,
                                bool* changed)
{
#if defined(CMAKE_USE_ELF_PARSER)
  if (changed) {
    *changed = false;
  }
  int rp_count = 0;
  bool remove_rpath = true;
  cmSystemToolsRPathInfo rp[2];
  {
    // Parse the ELF binary.
    cmELF elf(file.c_str());

    // Get the RPATH and RUNPATH entries from it.
    int se_count = 0;
    cmELF::StringEntry const* se[2] = { CM_NULLPTR, CM_NULLPTR };
    const char* se_name[2] = { CM_NULLPTR, CM_NULLPTR };
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      se[se_count] = se_rpath;
      se_name[se_count] = "RPATH";
      ++se_count;
    }
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      se[se_count] = se_runpath;
      se_name[se_count] = "RUNPATH";
      ++se_count;
    }
    if (se_count == 0) {
      if (newRPath.empty()) {
        // The new rpath is empty and there is no rpath anyway so it is
        // okay.
        return true;
      }
      if (emsg) {
        *emsg = "No valid ELF RPATH or RUNPATH entry exists in the file; ";
        *emsg += elf.GetErrorMessage();
      }
      return false;
    }

    for (int i = 0; i < se_count; ++i) {
      // If both RPATH and RUNPATH refer to the same string literal it
      // needs to be changed only once.
      if (rp_count && rp[0].Position == se[i]->Position) {
        continue;
      }

      // Make sure the current rpath contains the old rpath.
      std::string::size_type pos =
        cmSystemToolsFindRPath(se[i]->Value, oldRPath);
      if (pos == std::string::npos) {
        // If it contains the new rpath instead then it is okay.
        if (cmSystemToolsFindRPath(se[i]->Value, newRPath) !=
            std::string::npos) {
          remove_rpath = false;
          continue;
        }
        if (emsg) {
          std::ostringstream e;
          /* clang-format off */
        e << "The current " << se_name[i] << " is:\n"
          << "  " << se[i]->Value << "\n"
          << "which does not contain:\n"
          << "  " << oldRPath << "\n"
          << "as was expected.";
          /* clang-format on */
          *emsg = e.str();
        }
        return false;
      }

      // Store information about the entry in the file.
      rp[rp_count].Position = se[i]->Position;
      rp[rp_count].Size = se[i]->Size;
      rp[rp_count].Name = se_name[i];

      std::string::size_type prefix_len = pos;

      // If oldRPath was at the end of the file's RPath, and newRPath is empty,
      // we should remove the unnecessary ':' at the end.
      if (newRPath.empty() && pos > 0 && se[i]->Value[pos - 1] == ':' &&
          pos + oldRPath.length() == se[i]->Value.length()) {
        prefix_len--;
      }

      // Construct the new value which preserves the part of the path
      // not being changed.
      rp[rp_count].Value = se[i]->Value.substr(0, prefix_len);
      rp[rp_count].Value += newRPath;
      rp[rp_count].Value += se[i]->Value.substr(pos + oldRPath.length());

      if (!rp[rp_count].Value.empty()) {
        remove_rpath = false;
      }

      // Make sure there is enough room to store the new rpath and at
      // least one null terminator.
      if (rp[rp_count].Size < rp[rp_count].Value.length() + 1) {
        if (emsg) {
          *emsg = "The replacement path is too long for the ";
          *emsg += se_name[i];
          *emsg += " entry.";
        }
        return false;
      }

      // This entry is ready for update.
      ++rp_count;
    }
  }

  // If no runtime path needs to be changed, we are done.
  if (rp_count == 0) {
    return true;
  }

  // If the resulting rpath is empty, just remove the entire entry instead.
  if (remove_rpath) {
    return cmSystemTools::RemoveRPath(file, emsg, changed);
  }

  {
    // Open the file for update.
    cmsys::ofstream f(file.c_str(),
                      std::ios::in | std::ios::out | std::ios::binary);
    if (!f) {
      if (emsg) {
        *emsg = "Error opening file for update.";
      }
      return false;
    }

    // Store the new RPATH and RUNPATH strings.
    for (int i = 0; i < rp_count; ++i) {
      // Seek to the RPATH position.
      if (!f.seekp(rp[i].Position)) {
        if (emsg) {
          *emsg = "Error seeking to ";
          *emsg += rp[i].Name;
          *emsg += " position.";
        }
        return false;
      }

      // Write the new rpath.  Follow it with enough null terminators to
      // fill the string table entry.
      f << rp[i].Value;
      for (unsigned long j = rp[i].Value.length(); j < rp[i].Size; ++j) {
        f << '\0';
      }

      // Make sure it wrote correctly.
      if (!f) {
        if (emsg) {
          *emsg = "Error writing the new ";
          *emsg += rp[i].Name;
          *emsg += " string to the file.";
        }
        return false;
      }
    }
  }

  // Everything was updated successfully.
  if (changed) {
    *changed = true;
  }
  return true;
#else
  (void)file;
  (void)oldRPath;
  (void)newRPath;
  (void)emsg;
  (void)changed;
  return false;
#endif
}